

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

App * __thiscall CLI::App::add_subcommand(App *this,App_p *subcom)

{
  App *subcom_00;
  App *pAVar1;
  string *__rhs;
  IncorrectConstruction *this_00;
  OptionAlreadyAdded *this_01;
  App *base;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  subcom_00 = (subcom->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (subcom_00 == (App *)0x0) {
    this_00 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"passed App is not valid","");
    CLI::IncorrectConstruction::IncorrectConstruction(this_00,&local_60);
    __cxa_throw(this_00,&CLI::IncorrectConstruction::typeinfo,Error::~Error);
  }
  pAVar1 = this->parent_;
  base = this;
  if (this->parent_ != (App *)0x0 && (this->name_)._M_string_length == 0) {
    do {
      base = pAVar1;
      if (base->parent_ == (App *)0x0) break;
      pAVar1 = base->parent_;
    } while ((base->name_)._M_string_length == 0);
  }
  __rhs = _compare_subcommand_names_abi_cxx11_(this,subcom_00,base);
  if (__rhs->_M_string_length == 0) {
    ((subcom->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->parent_ = this;
    ::std::vector<std::shared_ptr<CLI::App>,std::allocator<std::shared_ptr<CLI::App>>>::
    emplace_back<std::shared_ptr<CLI::App>>
              ((vector<std::shared_ptr<CLI::App>,std::allocator<std::shared_ptr<CLI::App>>> *)
               &this->subcommands_,subcom);
    return (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  this_01 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
  ::std::operator+(&local_40,"subcommand name or alias matches existing subcommand: ",__rhs);
  CLI::OptionAlreadyAdded::OptionAlreadyAdded(this_01,&local_40);
  __cxa_throw(this_01,&CLI::OptionAlreadyAdded::typeinfo,Error::~Error);
}

Assistant:

CLI11_INLINE App *App::add_subcommand(CLI::App_p subcom) {
    if(!subcom)
        throw IncorrectConstruction("passed App is not valid");
    auto *ckapp = (name_.empty() && parent_ != nullptr) ? _get_fallthrough_parent() : this;
    const auto &mstrg = _compare_subcommand_names(*subcom, *ckapp);
    if(!mstrg.empty()) {
        throw(OptionAlreadyAdded("subcommand name or alias matches existing subcommand: " + mstrg));
    }
    subcom->parent_ = this;
    subcommands_.push_back(std::move(subcom));
    return subcommands_.back().get();
}